

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

istream * utility::read<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                    (istream *stream,vector<unsigned_short,_std::allocator<unsigned_short>_> *values
                    )

{
  pointer puVar1;
  long *plVar2;
  unsigned_short *value;
  pointer puVar3;
  int64_t n;
  size_t size;
  
  size = 0;
  plVar2 = (long *)std::istream::read((char *)stream,(long)&size);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(values,size);
    puVar1 = (values->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (values->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      n = 0;
      std::istream::read((char *)stream,(long)&n);
      *puVar3 = (unsigned_short)n;
    }
  }
  return stream;
}

Assistant:

std::istream & read (std::istream & stream, Container & values)
    {
        auto size = std::size_t{};
        if (burst::trivial_read(stream, size))
        {
            values.resize(size);

            for (auto & value: values)
            {
                auto n = std::int64_t{};
                burst::trivial_read(stream, n);
                value = static_cast<typename Container::value_type>(n);
            }
        }

        return stream;
    }